

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwJoystickPresent(int jid)

{
  GLFWbool GVar1;
  uint in_EDI;
  _GLFWjoystick *unaff_retaddr;
  _GLFWjoystick *js;
  int in_stack_fffffffffffffffc;
  int iVar2;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    iVar2 = 0;
  }
  else if (((int)in_EDI < 0) || (0xf < (int)in_EDI)) {
    _glfwInputError(0x10003,"Invalid joystick ID %i",(ulong)in_EDI);
    iVar2 = 0;
  }
  else {
    GVar1 = initJoysticks();
    if (GVar1 == 0) {
      iVar2 = 0;
    }
    else if (_glfw.joysticks[(int)in_EDI].present == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = _glfwPlatformPollJoystick(unaff_retaddr,in_stack_fffffffffffffffc);
    }
  }
  return iVar2;
}

Assistant:

GLFWAPI int glfwJoystickPresent(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    if (!initJoysticks())
        return GLFW_FALSE;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    return _glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE);
}